

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *
readFile(string *file)

{
  byte bVar1;
  undefined8 in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *in_RDI;
  bool exists;
  string res;
  ifstream in;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *this;
  allocator<char> local_291;
  allocator<char> *in_stack_fffffffffffffd70;
  allocator<char> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffd88;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffd98;
  allocator<char> local_239;
  string local_238 [32];
  undefined1 local_218 [536];
  
  this = in_RDI;
  std::ifstream::ifstream(local_218,in_RSI,8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::allocator<char>::~allocator(&local_239);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)this,
               (istream_type *)CONCAT17(bVar1,in_stack_fffffffffffffd48));
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffd40);
    in_stack_fffffffffffffd40 = (istreambuf_iterator<char,_std::char_traits<char>_> *)&local_291;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd98,in_stack_fffffffffffffd88,
               in_stack_fffffffffffffd78);
    std::__cxx11::string::operator=(local_238,(string *)&stack0xfffffffffffffd90);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
    std::allocator<char>::~allocator(&local_291);
  }
  std::ifstream::close();
  std::make_pair<std::__cxx11::string&,bool&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffd48),(bool *)in_stack_fffffffffffffd40);
  std::__cxx11::string::~string(local_238);
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

std::pair<std::string, bool> readFile(const std::string& file)
{
	std::ifstream in(file);
	std::string res = "";
	bool exists = false;
	if (in.is_open())
	{
		exists = true;
		res = { std::istreambuf_iterator<char>(in), std::istreambuf_iterator<char>() };
	}
    in.close();
	return std::make_pair(res, exists);
}